

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

void mtrap_display(menu *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  char *buf;
  uint8_t attr;
  void *pvVar1;
  undefined7 in_register_00000011;
  
  pvVar1 = menu_priv((menu_conflict *)menu);
  buf = *(char **)((long)pvVar1 + (long)oid * 0x88 + 0x10);
  my_strcap(buf);
  attr = '\x01';
  if ((int)CONCAT71(in_register_00000011,cursor) != 0) {
    attr = '\x0e';
  }
  c_put_str(attr,buf,row,col);
  return;
}

Assistant:

static void mtrap_display(struct menu *menu, int oid, bool cursor, int row,
				   int col, int width)
{
	const struct trap_kind *choice = menu_priv(menu);
	uint8_t attr = (cursor ? COLOUR_L_BLUE : COLOUR_WHITE);
	char *desc = choice[oid].desc;
	my_strcap(desc);

	/* Print it */
	c_put_str(attr, desc, row, col);
}